

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestTestHandler::GetValue(cmCTestTestHandler *this,char *tag,int *value,istream *fin)

{
  cmCTest *this_00;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  string line;
  ostringstream cmCTestLog_msg;
  undefined1 auStack_1e8 [8];
  string local_1e0;
  long *local_1c0;
  long local_1b0 [2];
  undefined1 local_1a0 [376];
  
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  cmsys::SystemTools::GetLineFromStream(fin,&local_1e0,(bool *)0x0,0xffffffffffffffff);
  iVar2 = std::__cxx11::string::compare((char *)&local_1e0);
  if (iVar2 == 0) {
    std::istream::operator>>(fin,value);
    bVar1 = cmsys::SystemTools::GetLineFromStream(fin,&local_1e0,(bool *)0x0,0xffffffffffffffff);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"parse error: missing tag: ",0x1a);
    if (tag == (char *)0x0) {
      std::ios::clear((int)(auStack_1e8 + (long)*(_func_int **)(local_1a0._0_8_ + -0x18)) + 0x48);
    }
    else {
      sVar3 = strlen(tag);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,tag,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," found [",8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    this_00 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x4d1,(char *)local_1c0,false);
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0,local_1b0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                             local_1e0.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool cmCTestTestHandler::GetValue(const char* tag, int& value,
                                  std::istream& fin)
{
  std::string line;
  bool ret = true;
  cmSystemTools::GetLineFromStream(fin, line);
  if (line == tag) {
    fin >> value;
    ret = cmSystemTools::GetLineFromStream(fin, line); // read blank line
  } else {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "parse error: missing tag: " << tag << " found [" << line << "]"
                                            << std::endl);
    ret = false;
  }
  return ret;
}